

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spin_lock.h
# Opt level: O0

void __thiscall
cornelich::util::spin_lock::lock<cornelich::util::default_backoff<5ul>>
          (spin_lock *this,default_backoff<5UL> backoff)

{
  __atomic_flag_data_type _Var1;
  spin_lock *this_local;
  default_backoff<5UL> backoff_local;
  
  this_local = (spin_lock *)backoff.m_count;
  while( true ) {
    backoff_local.m_count._4_4_ = 2;
    LOCK();
    _Var1 = (this->m_flag).super___atomic_flag_base._M_i;
    (this->m_flag).super___atomic_flag_base._M_i = true;
    UNLOCK();
    if (_Var1 == false) break;
    default_backoff<5UL>::operator()((default_backoff<5UL> *)&this_local);
  }
  return;
}

Assistant:

void lock(backoff_t backoff) noexcept
    {
        while(BOOST_UNLIKELY(m_flag.test_and_set(std::memory_order_acquire)))
            backoff();
    }